

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

float SliderBehaviorCalcRatioFromValue<unsigned_long_long,double>
                (ImGuiDataType data_type,unsigned_long_long v,unsigned_long_long v_min,
                unsigned_long_long v_max,float power,float linear_zero_pos)

{
  long lVar1;
  unsigned_long_long uVar2;
  long lVar3;
  undefined4 in_register_0000003c;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  fVar4 = 0.0;
  if (v_min != v) {
    lVar1 = v - v_min;
    uVar2 = v_min;
    if (v < v_min) {
      uVar2 = v;
    }
    if (v >= v_min && lVar1 != 0) {
      v_min = v;
    }
    lVar1 = -lVar1;
    if (CONCAT44(in_register_0000003c,data_type) < v_min) {
      v_min = CONCAT44(in_register_0000003c,data_type);
    }
    if (CONCAT44(in_register_0000003c,data_type) <= uVar2 &&
        uVar2 != CONCAT44(in_register_0000003c,data_type)) {
      v_min = uVar2;
    }
    lVar3 = v_min - v;
    auVar5._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar5._0_8_ = lVar3;
    auVar5._12_4_ = 0x45300000;
    auVar6._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar6._0_8_ = lVar1;
    auVar6._12_4_ = 0x45300000;
    fVar4 = (float)(((auVar5._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) /
                   ((auVar6._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)));
  }
  return fVar4;
}

Assistant:

static inline float SliderBehaviorCalcRatioFromValue(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, float power, float linear_zero_pos)
{
    if (v_min == v_max)
        return 0.0f;

    const bool is_power = (power != 1.0f) && (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double);
    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_power)
    {
        if (v_clamped < 0.0f)
        {
            const float f = 1.0f - (float)((v_clamped - v_min) / (ImMin((TYPE)0, v_max) - v_min));
            return (1.0f - ImPow(f, 1.0f/power)) * linear_zero_pos;
        }
        else
        {
            const float f = (float)((v_clamped - ImMax((TYPE)0, v_min)) / (v_max - ImMax((TYPE)0, v_min)));
            return linear_zero_pos + ImPow(f, 1.0f/power) * (1.0f - linear_zero_pos);
        }
    }

    // Linear slider
    return (float)((FLOATTYPE)(v_clamped - v_min) / (FLOATTYPE)(v_max - v_min));
}